

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbignum.cpp
# Opt level: O0

int __thiscall
CVmObjBigNum::getp_tan(CVmObjBigNum *this,vm_obj_id_t self,vm_val_t *retval,uint *argc)

{
  bool bVar1;
  int iVar2;
  undefined8 *puVar3;
  long *plVar4;
  char *tmp;
  err_frame_t err_cur__;
  char *pi;
  int invert_result;
  int neg_result;
  char *ext9;
  char *ext8;
  char *ext7;
  char *ext6;
  char *ext5;
  char *ext4;
  char *ext3;
  char *ext2;
  char *ext1;
  uint hdl9;
  uint hdl8;
  uint hdl7;
  uint hdl6;
  uint hdl5;
  uint hdl4;
  uint hdl3;
  uint hdl2;
  uint hdl1;
  size_t prec;
  char *new_ext;
  char *pcVar5;
  undefined4 uVar6;
  uint *puVar7;
  int round;
  char *pcVar8;
  uint *dst;
  char **in_stack_fffffffffffffda8;
  char *ext4_00;
  uint *in_stack_fffffffffffffdb0;
  char **remp;
  vm_val_t *in_stack_fffffffffffffdb8;
  char **ext2_00;
  undefined8 in_stack_fffffffffffffdc0;
  vm_obj_id_t self_00;
  char *ext2_01;
  CVmObjBigNum *in_stack_fffffffffffffdc8;
  char *ext1_00;
  CVmObjBigNum *this_00;
  char *ext5_00;
  char *in_stack_fffffffffffffde8;
  void *pvVar9;
  char *in_stack_fffffffffffffdf0;
  undefined8 uVar10;
  char *ext1_01;
  uint *new_ext_00;
  uint local_1c8 [2];
  undefined8 local_1c0;
  void *local_1b8;
  size_t in_stack_fffffffffffffef0;
  uint local_dc;
  char local_d0 [8];
  char *local_c8;
  char local_c0 [4];
  int iStack_bc;
  char *in_stack_ffffffffffffff48;
  char *in_stack_ffffffffffffff50;
  char *in_stack_ffffffffffffff58;
  char *in_stack_ffffffffffffff60;
  char *pcVar11;
  char *local_98;
  undefined4 local_8c;
  CVmObjBigNum local_88;
  uint local_78;
  uint local_74;
  uint local_70;
  uint local_6c;
  size_t local_68;
  char *local_60;
  
  self_00 = (vm_obj_id_t)((ulong)in_stack_fffffffffffffdc0 >> 0x20);
  local_68 = get_prec((char *)0x2b3429);
  iVar2 = setup_getp_0(in_stack_fffffffffffffdc8,self_00,in_stack_fffffffffffffdb8,
                       in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
  if (iVar2 == 0) {
    cache_pi(in_stack_fffffffffffffef0);
    pcVar5 = &stack0xffffffffffffff58;
    puVar7 = &local_74;
    pcVar8 = &stack0xffffffffffffff50;
    dst = &local_78;
    ext4_00 = local_c0;
    remp = &local_88.super_CVmObject.ext_;
    ext2_00 = &local_c8;
    ext2_01 = (char *)((long)&local_88.super_CVmObject._vptr_CVmObject + 4);
    ext1_00 = local_d0;
    this_00 = &local_88;
    ext5_00 = (char *)&local_8c;
    ext1_01 = pcVar5;
    new_ext_00 = puVar7;
    alloc_temp_regs(local_68 + 3,9,&local_98,&local_6c,&stack0xffffffffffffff60,&local_70,pcVar5);
    uVar6 = (undefined4)((ulong)pcVar5 >> 0x20);
    puVar3 = (undefined8 *)_ZTW11G_err_frame();
    local_1c0 = *puVar3;
    plVar4 = (long *)_ZTW11G_err_frame();
    *plVar4 = (long)local_1c8;
    local_1c8[0] = _setjmp((__jmp_buf_tag *)&stack0xfffffffffffffe50);
    iVar2 = (int)((ulong)puVar7 >> 0x20);
    if (local_1c8[0] == 0) {
      bVar1 = false;
      copy_val((char *)dst,pcVar8,iVar2);
      local_dc = get_neg(local_98);
      set_neg(local_98,0);
      copy_val((char *)dst,pcVar8,(int)((ulong)puVar7 >> 0x20));
      mul_by_long((char *)remp,(unsigned_long)ext4_00);
      while( true ) {
        pcVar5 = in_stack_ffffffffffffff60;
        iVar2 = compare_abs(ext1_00,ext2_01);
        round = (int)((ulong)puVar7 >> 0x20);
        if (iVar2 < 1) break;
        compute_quotient_into
                  (pcVar5,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
                   in_stack_ffffffffffffff48);
        in_stack_ffffffffffffff60 = local_98;
        local_98 = pcVar5;
      }
      copy_val((char *)dst,pcVar8,round);
      iVar2 = compare_abs(ext1_00,ext2_01);
      pcVar11 = pcVar5;
      if (0 < iVar2) {
        compute_abs_diff_into((char *)new_ext_00,ext1_01,in_stack_fffffffffffffdf0);
        pcVar11 = local_98;
        local_98 = pcVar5;
      }
      div_by_long(ext2_01,(unsigned_long)ext2_00,(unsigned_long *)remp);
      iVar2 = compare_abs(ext1_00,ext2_01);
      pcVar5 = pcVar11;
      if (0 < iVar2) {
        copy_val((char *)dst,pcVar8,round);
        compute_abs_diff_into((char *)new_ext_00,ext1_01,in_stack_fffffffffffffdf0);
        pcVar5 = local_98;
        local_98 = pcVar11;
      }
      iVar2 = get_neg(local_98);
      if (iVar2 != 0) {
        local_dc = (uint)((local_dc != 0 ^ 0xffU) & 1);
      }
      set_neg(local_98,0);
      copy_val((char *)dst,pcVar8,round);
      div_by_long(ext2_01,(unsigned_long)ext2_00,(unsigned_long *)remp);
      iVar2 = compare_abs(ext1_00,ext2_01);
      if (0 < iVar2) {
        copy_val((char *)dst,pcVar8,round);
        div_by_long(ext2_01,(unsigned_long)ext2_00,(unsigned_long *)remp);
        compute_abs_diff_into((char *)new_ext_00,ext1_01,in_stack_fffffffffffffdf0);
        iVar2 = get_neg(local_98);
        if (iVar2 != 0) {
          local_dc = (uint)((local_dc != 0 ^ 0xffU) & 1);
        }
        set_neg(local_98,0);
        bVar1 = true;
        pcVar5 = local_98;
      }
      copy_val((char *)dst,pcVar8,round);
      calc_sin_series(this_00,ext1_00,ext2_01,(char *)ext2_00,(char *)remp,ext4_00,ext5_00,
                      in_stack_fffffffffffffde8,in_stack_fffffffffffffdf0);
      pcVar8 = in_stack_ffffffffffffff48;
      iVar2 = iStack_bc;
      calc_cos_series(this_00,ext1_00,ext2_01,(char *)ext2_00,(char *)remp,ext4_00,ext5_00,
                      in_stack_fffffffffffffde8,in_stack_fffffffffffffdf0);
      uVar6 = (undefined4)((ulong)in_stack_ffffffffffffff48 >> 0x20);
      if (bVar1) {
        compute_quotient_into(pcVar5,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,pcVar8);
        pcVar8 = local_c8;
      }
      else {
        compute_quotient_into(pcVar5,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,pcVar8);
        pcVar8 = local_c8;
      }
      set_neg(local_60,local_dc);
      normalize((char *)dst);
    }
    if ((local_1c8[0] & 0x8000) == 0) {
      local_1c8[0] = local_1c8[0] | 0x8000;
      release_temp_regs(9,(ulong)local_6c,(ulong)local_70,(ulong)local_74,(ulong)local_78,
                        (ulong)local_88.super_CVmObject.ext_._4_4_,
                        CONCAT44(uVar6,local_88.super_CVmObject.ext_._0_4_),
                        CONCAT44(iVar2,local_88.super_CVmObject._vptr_CVmObject._4_4_),
                        CONCAT44((int)((ulong)pcVar8 >> 0x20),
                                 local_88.super_CVmObject._vptr_CVmObject._0_4_),
                        CONCAT44((int)((ulong)dst >> 0x20),local_8c));
    }
    uVar10 = local_1c0;
    puVar3 = (undefined8 *)_ZTW11G_err_frame();
    *puVar3 = uVar10;
    if ((local_1c8[0] & 0x4001) != 0) {
      puVar3 = (undefined8 *)_ZTW11G_err_frame();
      if ((*(uint *)*puVar3 & 2) != 0) {
        plVar4 = (long *)_ZTW11G_err_frame();
        free(*(void **)(*plVar4 + 0x10));
      }
      pvVar9 = local_1b8;
      plVar4 = (long *)_ZTW11G_err_frame();
      *(void **)(*plVar4 + 0x10) = pvVar9;
      err_rethrow();
    }
    if ((local_1c8[0] & 2) != 0) {
      free(local_1b8);
    }
    CVmStack::discard();
  }
  return 1;
}

Assistant:

int CVmObjBigNum::getp_tan(VMG_ vm_obj_id_t self,
                           vm_val_t *retval, uint *argc)
{
    char *new_ext;
    size_t prec = get_prec(ext_);
    uint hdl1, hdl2, hdl3, hdl4, hdl5, hdl6, hdl7, hdl8, hdl9;
    char *ext1, *ext2, *ext3, *ext4, *ext5, *ext6, *ext7, *ext8, *ext9;
    int neg_result;
    int invert_result;
    const char *pi;

    /* check arguments and set up the result */
    if (setup_getp_0(vmg_ self, retval, argc, &new_ext))
        return TRUE;

    /* cache pi to the working precision */
    pi = cache_pi(prec + 3);

    /* 
     *   Allocate our temporary registers for sin() and cos()
     *   calculations, plus two extra: one to hold the sine while we're
     *   calculating the cosine, and the other to hold the cosine result.
     *   
     *   (We could make do with fewer registers by copying values around,
     *   but if the numbers are of very high precision it's much cheaper
     *   to allocate more registers, since the registers come out of the
     *   register cache and probably won't require any actual memory
     *   allocation.)  
     */
    alloc_temp_regs(prec + 3, 9,
                    &ext1, &hdl1, &ext2, &hdl2, &ext3, &hdl3,
                    &ext4, &hdl4, &ext5, &hdl5, &ext6, &hdl6,
                    &ext7, &hdl7, &ext8, &hdl8, &ext9, &hdl9);

    /* protect against errors so we definitely free the registers */
    err_try
    {
        char *tmp;

        /* presume we won't have to invert our result */
        invert_result = FALSE;

        /* copy our initial value to ext1 */
        copy_val(ext1, ext_, FALSE);

        /* note that tan(-x) = -tan(x) - if x < 0, use -x */
        neg_result = get_neg(ext1);
        set_neg(ext1, FALSE);

        /* reduce the argument modulo 2*pi */
        copy_val(ext7, pi, TRUE);
        mul_by_long(ext7, 2);
        while (compare_abs(ext1, ext7) > 0)
        {
            /* divide by 2*pi, storing the remainder in r2 */
            compute_quotient_into(ext6, ext2, ext1, ext7);

            /* swap r2 into r1 for the next round */
            tmp = ext1;
            ext1 = ext2;
            ext2 = tmp;
        }

        /* 
         *   Next, note that tan(x+pi) = tan(x).  So, if x > pi, the
         *   argument by pi.  This will reduce our range to 0 <= x <= pi.  
         */
        copy_val(ext7, pi, TRUE);
        if (compare_abs(ext1, ext7) > 0)
        {
            /* subtract pi from the argument */
            compute_abs_diff_into(ext2, ext1, ext7);

            /* swap the result into r1 */
            tmp = ext1;
            ext1 = ext2;
            ext2 = tmp;
        }

        /*
         *   Use the fact that tan(x + pi) = tan(x) once again: if x >
         *   pi/2, subtract pi from x to adjust the range to -pi/2 <= x <=
         *   pi/2.  
         */
        div_by_long(ext7, 2);
        if (compare_abs(ext1, ext7) > 0)
        {
            /* subtract pi from the argument */
            copy_val(ext7, pi, TRUE);
            compute_abs_diff_into(ext2, ext1, ext7);

            /* swap the result into r1 */
            tmp = ext1;
            ext1 = ext2;
            ext2 = tmp;
        }

        /*
         *   once again, reduce our range using the sign equivalence -
         *   this will limit our range to 0 <= x <= pi/2 
         */
        if (get_neg(ext1))
            neg_result = !neg_result;
        set_neg(ext1, FALSE);

        /*
         *   Next, observe that tan(x+pi/2) = 1/tan(x).  If x > pi/4,
         *   invert the result.  
         */
        copy_val(ext7, pi, TRUE);
        div_by_long(ext7, 4);
        if (compare_abs(ext1, ext7) > 0)
        {
            /* calculate pi/2 */
            copy_val(ext7, pi, TRUE);
            div_by_long(ext7, 2);
            
            /* subtract pi/2 to get into range -pi/4 <= x <= pi/4 */
            compute_abs_diff_into(ext2, ext1, ext7);

            /* sin(-x) = -sin(x) */
            if (get_neg(ext1))
                neg_result = !neg_result;
            set_neg(ext1, FALSE);

            /* swap the result into r1 */
            tmp = ext1;
            ext1 = ext2;
            ext2 = tmp;

            /* note that we must invert the result */
            invert_result = TRUE;
        }

        /* 
         *   make a copy of our argument value in ext9 for safekeeping
         *   while we're calculating the sine 
         */
        copy_val(ext9, ext1, FALSE);

        /*
         *   We now have a value in the range 0 <= x <= pi/4, which will
         *   converge quickly with our Taylor series for sine and cosine.
         *   This will also ensure that both sin and cos are non-negative,
         *   so the sign we calculated for the tangent is all that matters
         *   for the sign.
         *   
         *   First, Calculate the sine and store the result in r8.  
         */
        calc_sin_series(vmg_ ext8,
                        ext1, ext2, ext3, ext4, ext5, ext6, ext7);

        /* 
         *   Calculate the cosine and store the result in r1.  Note that
         *   we saved the argument value in ext9 while we were working on
         *   the sine, so we can now use that value as the argument here.
         *   ext1 was trashed by the sine calculation, so just use it as
         *   the output register here.  
         */
        calc_cos_series(vmg_ ext1,
                        ext9, ext2, ext3, ext4, ext5, ext6, ext7);

        /* calculate the quotient sin/cos, or cos/sin if inverted */
        if (invert_result)
            compute_quotient_into(new_ext, 0, ext1, ext8);
        else
            compute_quotient_into(new_ext, 0, ext8, ext1);

        /* negate the result if necessary */
        set_neg(new_ext, neg_result);

        /* normalize the result */
        normalize(new_ext);
    }